

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_opn2.cpp
# Opt level: O0

void __thiscall OPN2::commitLFOSetup(OPN2 *this)

{
  byte bVar1;
  ulong local_20;
  size_t chip;
  uint8_t regLFOSetup;
  OPN2 *this_local;
  
  bVar1 = 0;
  if ((this->m_lfoEnable & 1U) != 0) {
    bVar1 = 8;
  }
  bVar1 = bVar1 | this->m_lfoFrequency & 7;
  this->m_regLFOSetup = bVar1;
  for (local_20 = 0; local_20 < this->m_numChips; local_20 = local_20 + 1) {
    writeReg(this,local_20,'\0','\"',bVar1);
  }
  return;
}

Assistant:

void OPN2::commitLFOSetup()
{
    uint8_t regLFOSetup = (m_lfoEnable ? 8 : 0) | (m_lfoFrequency & 7);
    m_regLFOSetup = regLFOSetup;
    for(size_t chip = 0; chip < m_numChips; ++chip)
        writeReg(chip, 0, 0x22, regLFOSetup);
}